

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::convertInitializerList
          (TParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer)

{
  long lVar1;
  EShSource EVar2;
  TVector<glslang::TArraySize> *pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  TType *type_00;
  TIntermediate *pTVar6;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TArraySizes *this_00;
  bool bVar7;
  char cVar8;
  int iVar9;
  TBasicType to;
  TBasicType from;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar11;
  long *plVar12;
  TTypeList *pTVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  pool_allocator<char> pVar14;
  long lVar15;
  TSmallArrayVector *this_01;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TIntermTyped *pTVar16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  char *pcVar17;
  size_t i;
  ulong uVar18;
  _func_int **pp_Var19;
  int d;
  int iVar20;
  TParseContext *pTVar21;
  TSourceLoc *pTVar22;
  TType arrayType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_208 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1e0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1b8 [40];
  TType elementType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  TIntermNode *node;
  
  iVar9 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  node = (TIntermNode *)CONCAT44(extraout_var,iVar9);
  if ((node != (TIntermNode *)0x0) && (node[5].loc.column == 0)) {
    iVar9 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar9 == '\0') {
      iVar9 = (*type->_vptr_TType[0x25])(type);
      pTVar22 = loc;
      if ((char)iVar9 == '\0') {
        iVar9 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar9 == '\0') {
          iVar9 = (*type->_vptr_TType[0x1b])(type);
          if ((char)iVar9 == '\0') {
            pTVar6 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            EVar2 = pTVar6->source;
            bVar7 = pTVar6->enhancedMsgs;
            pTVar21 = this;
            elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_208,"",(pool_allocator<char> *)&elementType);
            pVar14.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_f8,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
            name_00._M_dataplus._M_p = (pointer)local_f8;
            name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_208;
            name_00._M_string_length = (size_type)pTVar21;
            name_00.field_2._M_allocated_capacity = (size_type)pTVar22;
            name_00.field_2._8_8_ = pVar14.allocator;
            structName_00._M_dataplus._M_p = (pointer)arrayType._8_8_;
            structName_00._M_dataplus.super_allocator_type.allocator =
                 (TPoolAllocator *)arrayType._vptr_TType;
            structName_00._16_24_ = arrayType.qualifier._0_24_;
            TType::getCompleteString
                      ((TString *)&arrayType,type,(bool)(EVar2 == EShSourceGlsl & bVar7),true,true,
                       true,name_00,structName_00);
            pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar17 = "unexpected initializer-list type:";
          }
          else {
            iVar9 = (*type->_vptr_TType[0xc])(type);
            iVar20 = (*node->_vptr_TIntermNode[0x32])(node);
            if (iVar9 == (int)((ulong)(*(long *)(CONCAT44(extraout_var_11,iVar20) + 0x10) -
                                      *(long *)(CONCAT44(extraout_var_11,iVar20) + 8)) >> 3)) {
              to = (*type->_vptr_TType[7])(type);
              loc = pTVar22;
              for (lVar15 = 0; iVar9 = (*type->_vptr_TType[0xc])(type), pTVar22 = loc,
                  lVar15 < iVar9; lVar15 = lVar15 + 1) {
                iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
                plVar11 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_12,iVar9)
                                                                    + 8) + lVar15 * 8) + 0x18))();
                from = (**(code **)(*plVar11 + 0x100))(plVar11);
                if ((to != from) &&
                   (bVar7 = TIntermediate::canImplicitlyPromote
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,from,to,EOpNull), !bVar7)) {
                  pTVar6 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  EVar2 = pTVar6->source;
                  bVar7 = pTVar6->enhancedMsgs;
                  pTVar21 = this;
                  elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  basic_string<glslang::std::allocator<char>>
                            (local_a8,"",(pool_allocator<char> *)&elementType);
                  pVar14.allocator = GetThreadPoolAllocator();
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  basic_string<glslang::std::allocator<char>>
                            (local_d0,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
                  name_02._M_dataplus._M_p = (pointer)local_d0;
                  name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_a8;
                  name_02._M_string_length = (size_type)pTVar21;
                  name_02.field_2._M_allocated_capacity = (size_type)loc;
                  name_02.field_2._8_8_ = pVar14.allocator;
                  structName_02._M_dataplus._M_p = (pointer)arrayType._8_8_;
                  structName_02._M_dataplus.super_allocator_type.allocator =
                       (TPoolAllocator *)arrayType._vptr_TType;
                  structName_02._16_24_ = arrayType.qualifier._0_24_;
                  TType::getCompleteString
                            ((TString *)&arrayType,type,(bool)(EVar2 == EShSourceGlsl & bVar7),true,
                             true,true,name_02,structName_02);
                  pp_Var19 = (this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions;
                  pcVar17 = "type mismatch in initializer list";
                  goto LAB_003ae4d0;
                }
              }
              goto LAB_003ae14f;
            }
            pTVar6 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            EVar2 = pTVar6->source;
            bVar7 = pTVar6->enhancedMsgs;
            pTVar21 = this;
            elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_1e0,"",(pool_allocator<char> *)&elementType);
            pVar14.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_80,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
            name_01._M_dataplus._M_p = (pointer)local_80;
            name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_1e0;
            name_01._M_string_length = (size_type)pTVar21;
            name_01.field_2._M_allocated_capacity = (size_type)pTVar22;
            name_01.field_2._8_8_ = pVar14.allocator;
            structName_01._M_dataplus._M_p = (pointer)arrayType._8_8_;
            structName_01._M_dataplus.super_allocator_type.allocator =
                 (TPoolAllocator *)arrayType._vptr_TType;
            structName_01._16_24_ = arrayType.qualifier._0_24_;
            TType::getCompleteString
                      ((TString *)&arrayType,type,(bool)(EVar2 == EShSourceGlsl & bVar7),true,true,
                       true,name_01,structName_01);
            pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar17 = "wrong vector size (or rows in a matrix column):";
          }
        }
        else {
          iVar9 = (*type->_vptr_TType[0xd])();
          iVar20 = (*node->_vptr_TIntermNode[0x32])(node);
          if (iVar9 == (int)((ulong)(*(long *)(CONCAT44(extraout_var_07,iVar20) + 0x10) -
                                    *(long *)(CONCAT44(extraout_var_07,iVar20) + 8)) >> 3)) {
            lVar15 = 0;
            TType::TType(&arrayType,type,0,false);
            while (iVar9 = (*type->_vptr_TType[0xd])(type), lVar15 < iVar9) {
              iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
              pTVar16 = (TIntermTyped *)
                        (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_08,iVar9) + 8) +
                                                lVar15 * 8) + 0x18))();
              pTVar16 = convertInitializerList(this,loc,&arrayType,pTVar16);
              iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
              *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_09,iVar9) + 8) + lVar15 * 8) =
                   pTVar16;
              iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
              lVar1 = lVar15 * 8;
              lVar15 = lVar15 + 1;
              if (*(long *)(*(long *)(CONCAT44(extraout_var_10,iVar9) + 8) + lVar1) == 0) {
                return (TIntermTyped *)0x0;
              }
            }
            goto LAB_003ae14f;
          }
          pTVar6 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar2 = pTVar6->source;
          bVar7 = pTVar6->enhancedMsgs;
          pTVar21 = this;
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_1b8,"",(pool_allocator<char> *)&elementType);
          pVar14.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_58,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
          name._M_dataplus._M_p = (pointer)local_58;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_1b8;
          name._M_string_length = (size_type)pTVar21;
          name.field_2._M_allocated_capacity = (size_type)pTVar22;
          name.field_2._8_8_ = pVar14.allocator;
          structName._M_dataplus._M_p = (pointer)arrayType._8_8_;
          structName._M_dataplus.super_allocator_type.allocator =
               (TPoolAllocator *)arrayType._vptr_TType;
          structName._16_24_ = arrayType.qualifier._0_24_;
          TType::getCompleteString
                    ((TString *)&arrayType,type,(bool)(EVar2 == EShSourceGlsl & bVar7),true,true,
                     true,name,structName);
          pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar17 = "wrong number of matrix columns:";
        }
      }
      else {
        pTVar13 = TType::getStruct(type);
        pTVar4 = (pTVar13->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pTVar5 = (pTVar13->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
        if ((long)pTVar4 - (long)pTVar5 >> 5 ==
            *(long *)(CONCAT44(extraout_var_03,iVar9) + 0x10) -
            *(long *)(CONCAT44(extraout_var_03,iVar9) + 8) >> 3) {
          lVar15 = 0;
          uVar18 = 0;
          while (pTVar13 = TType::getStruct(type),
                uVar18 < (ulong)((long)(pTVar13->
                                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ).
                                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pTVar13->
                                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ).
                                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            pTVar13 = TType::getStruct(type);
            type_00 = *(TType **)
                       ((long)&((pTVar13->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_start)->type + lVar15 * 4);
            iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
            pTVar16 = (TIntermTyped *)
                      (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_04,iVar9) + 8) +
                                              lVar15) + 0x18))();
            pTVar16 = convertInitializerList(this,pTVar22,type_00,pTVar16);
            iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
            *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_05,iVar9) + 8) + lVar15) = pTVar16;
            iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
            uVar18 = uVar18 + 1;
            plVar11 = (long *)(*(long *)(CONCAT44(extraout_var_06,iVar9) + 8) + lVar15);
            lVar15 = lVar15 + 8;
            if (*plVar11 == 0) {
              return (TIntermTyped *)0x0;
            }
          }
LAB_003ae14f:
          loc = pTVar22;
          iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
          if (*(long *)(CONCAT44(extraout_var_13,iVar9) + 0x10) -
              *(long *)(CONCAT44(extraout_var_13,iVar9) + 8) == 8) {
            iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
            node = (TIntermNode *)**(undefined8 **)(CONCAT44(extraout_var_14,iVar9) + 8);
          }
LAB_003ae41c:
          pTVar16 = addConstructor(this,loc,node,type);
          return pTVar16;
        }
        pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar17 = "wrong number of structure members";
        arrayType._8_8_ = "";
      }
LAB_003ae4d0:
      initializer = (TIntermTyped *)0x0;
      (*pp_Var19[0x2d])(this,loc,pcVar17,"initializer list",arrayType._8_8_);
    }
    else {
      iVar20 = 1;
      TType::TType(&arrayType,EbtVoid,EvqTemporary,1,0,0,false);
      TType::shallowCopy(&arrayType,type);
      iVar9 = (*type->_vptr_TType[0x13])(type);
      TType::copyArraySizes(&arrayType,(TArraySizes *)CONCAT44(extraout_var_00,iVar9));
      iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
      TArraySizes::changeOuterSize
                (arrayType.arraySizes,
                 (int)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar9) + 0x10) -
                              *(long *)(CONCAT44(extraout_var_01,iVar9) + 8)) >> 3));
      iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
      plVar11 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_02,iVar9) + 8)
                                    + 0x18))();
      bVar7 = TType::isArrayOfArrays(&arrayType);
      if (bVar7) {
        plVar12 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
        cVar8 = (**(code **)(*plVar12 + 0xe8))(plVar12);
        if (cVar8 != '\0') {
          pTVar3 = ((arrayType.arraySizes)->sizes).sizes;
          if (pTVar3 == (TVector<glslang::TArraySize> *)0x0) {
            iVar9 = 0;
          }
          else {
            iVar9 = (int)((ulong)((long)(pTVar3->
                                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ).
                                        super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pTVar3->
                                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                       ).
                                       super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          plVar12 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
          lVar15 = (**(code **)(*plVar12 + 0x98))(plVar12);
          lVar15 = *(long *)(lVar15 + 8);
          if (lVar15 != 0) {
            iVar20 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4) + 1;
          }
          if (iVar9 == iVar20) {
            iVar9 = 1;
            while( true ) {
              pTVar3 = ((arrayType.arraySizes)->sizes).sizes;
              if (pTVar3 == (TVector<glslang::TArraySize> *)0x0) {
                iVar20 = 0;
              }
              else {
                iVar20 = (int)((ulong)((long)(pTVar3->
                                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                             ).
                                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar3->
                                            super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                            ).
                                            super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
              }
              if (iVar20 <= iVar9) break;
              uVar10 = TSmallArrayVector::getDimSize(&(arrayType.arraySizes)->sizes,iVar9);
              this_00 = arrayType.arraySizes;
              if (uVar10 == 0) {
                plVar12 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                this_01 = (TSmallArrayVector *)(**(code **)(*plVar12 + 0x98))(plVar12);
                uVar10 = TSmallArrayVector::getDimSize(this_01,iVar9 + -1);
                TSmallArrayVector::setDimSize(&this_00->sizes,iVar9,uVar10);
              }
              iVar9 = iVar9 + 1;
            }
          }
        }
      }
      initializer = (TIntermTyped *)0x0;
      TType::TType(&elementType,&arrayType,0,false);
      uVar18 = 0;
      do {
        iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
        if ((ulong)(*(long *)(CONCAT44(extraout_var_15,iVar9) + 0x10) -
                    *(long *)(CONCAT44(extraout_var_15,iVar9) + 8) >> 3) <= uVar18) {
          type = &arrayType;
          goto LAB_003ae41c;
        }
        iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
        pTVar16 = (TIntermTyped *)
                  (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_16,iVar9) + 8) +
                                          uVar18 * 8) + 0x18))();
        pTVar16 = convertInitializerList(this,loc,&elementType,pTVar16);
        iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
        *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_17,iVar9) + 8) + uVar18 * 8) = pTVar16;
        iVar9 = (*node->_vptr_TIntermNode[0x32])(node);
        lVar15 = uVar18 * 8;
        uVar18 = uVar18 + 1;
      } while (*(long *)(*(long *)(CONCAT44(extraout_var_18,iVar9) + 8) + lVar15) != 0);
    }
  }
  return initializer;
}

Assistant:

TIntermTyped* TParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type, TIntermTyped* initializer)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (! initList || initList->getOp() != EOpNull)
        return initializer;

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes());  // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        arrayType.changeOuterArraySize((int)initList->getSequence().size());
        TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
        if (arrayType.isArrayOfArrays() && firstInit->getType().isArray() &&
            arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
            for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                    arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
            }
        }

        TType elementType(arrayType, 0); // dereferenced type
        for (size_t i = 0; i < initList->getSequence().size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.getMatrixCols() != (int)initList->getSequence().size()) {
            error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TType vectorType(type, 0); // dereferenced type
        for (int i = 0; i < type.getMatrixCols(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, vectorType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isVector()) {
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TBasicType destType = type.getBasicType();
        for (int i = 0; i < type.getVectorSize(); ++i) {
            TBasicType initType = initList->getSequence()[i]->getAsTyped()->getBasicType();
            if (destType != initType && !intermediate.canImplicitlyPromote(initType, destType)) {
                error(loc, "type mismatch in initializer list", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
                return nullptr;
            }

        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermNode* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0];
    else
        emulatedConstructorArguments = initList;
    return addConstructor(loc, emulatedConstructorArguments, type);
}